

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetDirectoryPropertyCommand.cxx
# Opt level: O2

bool cmGetDirectoryPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  cmMakefile *this;
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  cmGlobalGenerator *this_00;
  cmMakefile *pcVar4;
  char *pcVar5;
  size_type sVar6;
  cmValue value;
  pointer __s;
  PolicyID id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string_view value_00;
  allocator<char> local_69;
  string sd;
  allocator<char> local_48 [32];
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)name) < 0x21) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sd,"called with incorrect number of arguments",local_48);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_002f45e7;
  }
  __lhs = name + 1;
  pcVar4 = status->Makefile;
  bVar1 = std::operator==(__lhs,"DIRECTORY");
  if (!bVar1) {
LAB_002f467d:
    bVar1 = std::operator==(__lhs,"DEFINITION");
    if (bVar1) {
      if (__lhs + 1 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sd,
                   "A request for a variable definition was made without providing the name of the variable to get."
                   ,local_48);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002f45e7;
      }
      psVar3 = cmMakefile::GetSafeDefinition(pcVar4,__lhs + 1);
      pcVar4 = status->Makefile;
      __s = (psVar3->_M_dataplus)._M_p;
      sVar6 = psVar3->_M_string_length;
    }
    else {
      if (__lhs->_M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&sd,"given empty string for the property name to get",local_48);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002f45e7;
      }
      bVar1 = std::operator==(__lhs,"DEFINITIONS");
      if (!bVar1) {
LAB_002f4781:
        this = status->Makefile;
        value = cmMakefile::GetProperty(pcVar4,__lhs);
        cmMakefile::AddDefinition(this,name,value);
        return true;
      }
      PVar2 = cmMakefile::GetPolicyStatus(status->Makefile,CMP0059,false);
      if (PVar2 != OLD) {
        if (PVar2 != WARN) goto LAB_002f4781;
        pcVar4 = status->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&sd,(cmPolicies *)0x3b,id);
        cmMakefile::IssueMessage(pcVar4,AUTHOR_WARNING,&sd);
        std::__cxx11::string::~string((string *)&sd);
      }
      pcVar4 = status->Makefile;
      pcVar5 = cmMakefile::GetDefineFlagsCMP0059(pcVar4);
      __s = "";
      if (pcVar5 != (char *)0x0) {
        __s = pcVar5;
      }
      sVar6 = strlen(__s);
    }
    value_00._M_str = __s;
    value_00._M_len = sVar6;
    cmMakefile::AddDefinition(pcVar4,name,value_00);
    return true;
  }
  if (name + 2 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sd,"DIRECTORY argument provided without subsequent arguments",local_48);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_002f45e7;
  }
  psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
  cmsys::SystemTools::CollapseFullPath(&sd,name + 2,psVar3);
  this_00 = cmMakefile::GetGlobalGenerator(status->Makefile);
  pcVar4 = cmGlobalGenerator::FindMakefile(this_00,&sd);
  if (pcVar4 == (cmMakefile *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,
               "DIRECTORY argument provided but requested directory not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
               ,&local_69);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __lhs = name + 3;
    if (__lhs != (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&sd);
      goto LAB_002f467d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"called with incorrect number of arguments",&local_69);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)local_48);
LAB_002f45e7:
  std::__cxx11::string::~string((string *)&sd);
  return false;
}

Assistant:

bool cmGetDirectoryPropertyCommand(std::vector<std::string> const& args,
                                   cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  auto i = args.begin();
  std::string const& variable = *i;
  ++i;

  // get the directory argument if there is one
  cmMakefile* dir = &status.GetMakefile();
  if (*i == "DIRECTORY") {
    ++i;
    if (i == args.end()) {
      status.SetError(
        "DIRECTORY argument provided without subsequent arguments");
      return false;
    }
    std::string sd = cmSystemTools::CollapseFullPath(
      *i, status.GetMakefile().GetCurrentSourceDirectory());

    // lookup the makefile from the directory name
    dir = status.GetMakefile().GetGlobalGenerator()->FindMakefile(sd);
    if (!dir) {
      status.SetError(
        "DIRECTORY argument provided but requested directory not found. "
        "This could be because the directory argument was invalid or, "
        "it is valid but has not been processed yet.");
      return false;
    }
    ++i;
    if (i == args.end()) {
      status.SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // OK, now we have the directory to process, we just get the requested
  // information out of it

  if (*i == "DEFINITION") {
    ++i;
    if (i == args.end()) {
      status.SetError("A request for a variable definition was made without "
                      "providing the name of the variable to get.");
      return false;
    }
    std::string const& output = dir->GetSafeDefinition(*i);
    status.GetMakefile().AddDefinition(variable, output);
    return true;
  }

  if (i->empty()) {
    status.SetError("given empty string for the property name to get");
    return false;
  }

  if (*i == "DEFINITIONS") {
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0059)) {
      case cmPolicies::WARN:
        status.GetMakefile().IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmPolicies::GetPolicyWarning(cmPolicies::CMP0059));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        StoreResult(status.GetMakefile(), variable,
                    status.GetMakefile().GetDefineFlagsCMP0059());
        return true;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
        break;
    }
  }
  StoreResult(status.GetMakefile(), variable, dir->GetProperty(*i));
  return true;
}